

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVmCommon.cpp
# Opt level: O0

VmConstant * CreateConstantZero(Allocator *allocator,SynBase *source,VmType type)

{
  bool bVar1;
  SynBase *source_local;
  Allocator *allocator_local;
  VmType type_local;
  
  type_local._0_8_ = type.structType;
  allocator_local = type._0_8_;
  bVar1 = VmType::operator==((VmType *)&allocator_local,&VmType::Int);
  if (bVar1) {
    type_local.structType = (TypeBase *)CreateConstantInt(allocator,source,0);
  }
  else {
    bVar1 = VmType::operator==((VmType *)&allocator_local,&VmType::Double);
    if (bVar1) {
      type_local.structType = (TypeBase *)CreateConstantDouble(allocator,source,0.0);
    }
    else {
      bVar1 = VmType::operator==((VmType *)&allocator_local,&VmType::Long);
      if (!bVar1) {
        __assert_fail("!\"unknown type\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVmCommon.cpp"
                      ,0xa2,"VmConstant *CreateConstantZero(Allocator *, SynBase *, VmType)");
      }
      type_local.structType = (TypeBase *)CreateConstantLong(allocator,source,0);
    }
  }
  return (VmConstant *)type_local.structType;
}

Assistant:

VmConstant* CreateConstantZero(Allocator *allocator, SynBase *source, VmType type)
{
	if(type == VmType::Int)
		return CreateConstantInt(allocator, source, 0);

	if(type == VmType::Double)
		return CreateConstantDouble(allocator, source, 0);

	if(type == VmType::Long)
		return CreateConstantLong(allocator, source, 0);

	assert(!"unknown type");
	return NULL;
}